

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::AlphaToCoverageInstance::verifyImage
          (TestStatus *__return_storage_ptr__,AlphaToCoverageInstance *this,
          ConstPixelBufferAccess *result)

{
  TextureFormat TVar1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  int iVar5;
  int iVar6;
  ostringstream message;
  float local_1d4;
  undefined1 local_1c8 [32];
  ConstPixelBufferAccess local_1a8 [2];
  ios_base local_138 [264];
  
  uVar3 = this->m_geometryType - GEOMETRY_TYPE_OPAQUE_QUAD;
  local_1d4 = 0.0;
  if (uVar3 < 5) {
    local_1d4 = *(float *)(&DAT_00ae29f0 + (ulong)uVar3 * 4);
  }
  iVar5 = (this->m_renderSize).m_data[1];
  bVar2 = 0 < iVar5;
  if (0 < iVar5) {
    iVar5 = 0;
    do {
      if (0 < (this->m_renderSize).m_data[0]) {
        iVar6 = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixel(local_1a8,(int)result,iVar6,iVar5);
          if (local_1d4 < (float)local_1a8[0].m_format.order) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Pixel is not below the threshold value (",0x28);
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)local_1c8,(int)result,iVar6,iVar5);
            poVar4 = std::ostream::_M_insert<double>((double)(float)local_1c8._0_4_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," > ",3);
            poVar4 = std::ostream::_M_insert<double>((double)local_1d4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
            std::__cxx11::stringbuf::str();
            __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
            (__return_storage_ptr__->m_description)._M_dataplus._M_p =
                 (pointer)&(__return_storage_ptr__->m_description).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&__return_storage_ptr__->m_description,
                       CONCAT44(local_1c8._4_4_,local_1c8._0_4_),
                       local_1c8._8_8_ + CONCAT44(local_1c8._4_4_,local_1c8._0_4_));
            if ((undefined1 *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_) != local_1c8 + 0x10) {
              operator_delete((undefined1 *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_),
                              local_1c8._16_8_ + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            if (bVar2) {
              return __return_storage_ptr__;
            }
            goto LAB_004bc8f0;
          }
          iVar6 = iVar6 + 1;
        } while (iVar6 < (this->m_renderSize).m_data[0]);
      }
      iVar5 = iVar5 + 1;
      iVar6 = (this->m_renderSize).m_data[1];
      bVar2 = iVar5 < iVar6;
    } while (iVar5 < iVar6);
  }
LAB_004bc8f0:
  TVar1 = (TextureFormat)(local_1a8[0].m_size.m_data + 2);
  local_1a8[0].m_format = TVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"Image matches reference value","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_1a8[0].m_format,
             (undefined1 *)(local_1a8[0].m_size.m_data._0_8_ + (long)local_1a8[0].m_format));
  if (local_1a8[0].m_format != TVar1) {
    operator_delete((void *)local_1a8[0].m_format,local_1a8[0]._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus AlphaToCoverageInstance::verifyImage (const tcu::ConstPixelBufferAccess&	result)
{
	float maxColorValue;

	switch (m_geometryType)
	{
		case GEOMETRY_TYPE_OPAQUE_QUAD:
			maxColorValue = 1.01f;
			break;

		case GEOMETRY_TYPE_TRANSLUCENT_QUAD:
			maxColorValue = 0.52f;
			break;

		case GEOMETRY_TYPE_INVISIBLE_QUAD:
			maxColorValue = 0.01f;
			break;

		default:
			maxColorValue = 0.0f;
			DE_ASSERT(false);
	}

	for (int y = 0; y < m_renderSize.y(); y++)
	{
		for (int x = 0; x < m_renderSize.x(); x++)
		{
			if (result.getPixel(x, y).x() > maxColorValue)
			{
				std::ostringstream message;
				message << "Pixel is not below the threshold value (" << result.getPixel(x, y).x() << " > " << maxColorValue << ")";
				return tcu::TestStatus::fail(message.str());
			}
		}
	}

	return tcu::TestStatus::pass("Image matches reference value");
}